

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2Clip(LWOImporter *this,uint length)

{
  uint8_t **outFile;
  byte bVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  pointer pCVar5;
  byte *pbVar6;
  uint uVar7;
  uint32_t uVar8;
  SubChunkHeader SVar9;
  Logger *this_00;
  DeadlyImportError *pDVar10;
  char *message;
  uint uVar11;
  string s;
  ostringstream ss;
  undefined4 uStack_1c4;
  _Alloc_hider local_1c0;
  undefined1 local_1b8 [24];
  undefined8 local_1a0;
  bool local_198;
  string local_50 [32];
  
  if (length < 10) {
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"LWO: CLIP chunk is too small",(allocator<char> *)&s);
    DeadlyImportError::DeadlyImportError(pDVar10,(string *)&ss);
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  _ss = UNSUPPORTED;
  local_1c0._M_p = local_1b8 + 8;
  local_1b8._0_8_ = 0;
  local_1b8[8] = '\0';
  local_198 = false;
  local_1a0._0_4_ = 0;
  local_1a0._4_4_ = 0;
  std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::
  emplace_back<Assimp::LWO::Clip>(&this->mClips,(Clip *)&ss);
  std::__cxx11::string::~string((string *)&local_1c0);
  pCVar5 = (this->mClips).super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  outFile = &this->mFileBuffer;
  uVar11 = *(uint *)this->mFileBuffer;
  this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
  pCVar5[-1].idx =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  SVar9 = IFF::LoadSubChunk(outFile);
  uVar8 = SVar9.type;
  if (uVar8 == 0x414e494d) {
    this_00 = DefaultLogger::get();
    message = "LWO2: Animated textures are not supported";
  }
  else {
    uVar11 = SVar9._4_4_;
    if (uVar8 == 0x49534551) {
      if (0xf < (uVar11 & 0xffff)) {
        pbVar6 = *outFile;
        *outFile = pbVar6 + 1;
        bVar1 = *pbVar6;
        *outFile = pbVar6 + 2;
        uVar3 = *(ushort *)(pbVar6 + 2);
        *outFile = pbVar6 + 8;
        uVar4 = *(ushort *)(pbVar6 + 8);
        *outFile = pbVar6 + 0xe;
        s._M_dataplus._M_p = (pointer)&s.field_2;
        s._M_string_length = 0;
        s.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        GetS0(this,&s,uVar11 & 0xffff);
        uVar7 = (uint)s._M_string_length;
        std::operator<<((ostream *)&ss,(string *)&s);
        *(ulong *)(local_1b8 + *(long *)(CONCAT44(uStack_1c4,_ss) + -0x18)) = (ulong)bVar1;
        std::ostream::operator<<
                  (&ss,(int)(short)(uVar4 << 8 | uVar4 >> 8) + (int)(short)(uVar3 << 8 | uVar3 >> 8)
                  );
        GetS0(this,&s,~uVar7 + uVar11 & 0xffff);
        std::operator<<((ostream *)&ss,(string *)&s);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&pCVar5[-1].path,local_50);
        std::__cxx11::string::~string(local_50);
        pCVar5[-1].type = SEQ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::__cxx11::string::~string((string *)&s);
        return;
      }
      pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"LWO: ISEQ chunk is too small",(allocator<char> *)&s);
      DeadlyImportError::DeadlyImportError(pDVar10,(string *)&ss);
      __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uVar8 == 0x4e454741) {
      if (((ulong)SVar9 & 0xfffe00000000) != 0) {
        sVar2 = *(short *)*outFile;
        *outFile = (uint8_t *)((long)*outFile + 2);
        pCVar5[-1].negate = sVar2 != 0;
        return;
      }
      pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"LWO: NEGA chunk is too small",(allocator<char> *)&s);
      DeadlyImportError::DeadlyImportError(pDVar10,(string *)&ss);
      __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uVar8 == 0x53544343) {
      this_00 = DefaultLogger::get();
      message = "LWO2: Color shifted images are not supported";
    }
    else {
      if (uVar8 == 0x5354494c) {
        if (((ulong)SVar9 & 0xffff00000000) != 0) {
          GetS0(this,&pCVar5[-1].path,uVar11 & 0xffff);
          pCVar5[-1].type = STILL;
          return;
        }
        pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"LWO: STIL chunk is too small",(allocator<char> *)&s);
        DeadlyImportError::DeadlyImportError(pDVar10,(string *)&ss);
        __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar8 == 0x58524546) {
        if (((ulong)SVar9 & 0xfffc00000000) != 0) {
          pCVar5[-1].type = REF;
          uVar11 = *(uint *)*outFile;
          *outFile = (uint8_t *)((long)*outFile + 4);
          pCVar5[-1].clipRef =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          return;
        }
        pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"LWO: XREF chunk is too small",(allocator<char> *)&s);
        DeadlyImportError::DeadlyImportError(pDVar10,(string *)&ss);
        __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = DefaultLogger::get();
      message = "LWO2: Encountered unknown CLIP sub-chunk";
    }
  }
  Logger::warn(this_00,message);
  return;
}

Assistant:

void LWOImporter::LoadLWO2Clip(unsigned int length)
{
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,CLIP,10);

    mClips.push_back(LWO::Clip());
    LWO::Clip& clip = mClips.back();

    // first - get the index of the clip
    clip.idx = GetU4();

    IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);
    switch (head.type)
    {
    case AI_LWO_STIL:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,STIL,1);

        // "Normal" texture
        GetS0(clip.path,head.length);
        clip.type = Clip::STILL;
        break;

    case AI_LWO_ISEQ:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ISEQ,16);
        // Image sequence. We'll later take the first.
        {
            uint8_t digits = GetU1();  mFileBuffer++;
            int16_t offset = GetU2();  mFileBuffer+=4;
            int16_t start  = GetU2();  mFileBuffer+=4;

            std::string s;
            std::ostringstream ss;
            GetS0(s,head.length);

            head.length -= (uint16_t)s.length()+1;
            ss << s;
            ss << std::setw(digits) << offset + start;
            GetS0(s,head.length);
            ss << s;
            clip.path = ss.str();
            clip.type = Clip::SEQ;
        }
        break;

    case AI_LWO_STCC:
        ASSIMP_LOG_WARN("LWO2: Color shifted images are not supported");
        break;

    case AI_LWO_ANIM:
        ASSIMP_LOG_WARN("LWO2: Animated textures are not supported");
        break;

    case AI_LWO_XREF:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,XREF,4);

        // Just a cross-reference to another CLIp
        clip.type = Clip::REF;
        clip.clipRef = GetU4();
        break;

    case AI_LWO_NEGA:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,NEGA,2);
        clip.negate = (0 != GetU2());
        break;

    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown CLIP sub-chunk");
    }
}